

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O2

void __thiscall
binlog::SessionWriter::SessionWriter
          (SessionWriter *this,Session *session,size_t queueCapacity,uint64_t id,string *name)

{
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var1;
  char *pcVar2;
  string local_70;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  undefined8 local_28;
  
  this->_session = session;
  local_50 = 0;
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  local_28 = 0;
  Session::createChannel((Session *)&this->_channel,(size_t)session,(WriterProp *)queueCapacity);
  std::__cxx11::string::~string((string *)&local_48);
  _Var1.super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (((this->_channel).super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>;
  (this->_qw)._queue =
       (Queue *)((long)_Var1.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
  pcVar2 = *(char **)((long)_Var1.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
  (this->_qw)._writePos = pcVar2;
  (this->_qw)._writeEnd = pcVar2;
  if (id != 0) {
    setId(this,id);
  }
  if (name->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_70,(string *)name);
    setName(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

inline SessionWriter::SessionWriter(Session& session, std::size_t queueCapacity, std::uint64_t id, std::string name)
  :_session(& session),
   _channel(session.createChannel(queueCapacity)),
   _qw(_channel->queue())
{
  if (id != 0) { setId(id); }
  if (! name.empty()) { setName(std::move(name)); }
}